

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O2

bool XYZ2NEU(XYZ station,XYZ obj,ELLIPSOID type,XYZ *neu)

{
  double dVar1;
  double dVar2;
  double __x;
  double __x_00;
  double *pdVar3;
  Matrix<double,_3,_3> *this;
  double local_98;
  Vector3d result;
  Vector3d vec;
  Matrix3d rotation;
  BLH station_blh;
  
  station_blh.B = 0.0;
  station_blh.L = 0.0;
  station_blh.H = 0.0;
  XYZ2BLH(station,type,&station_blh);
  __x = (station_blh.B * 3600.0) / 206264.80624709636;
  __x_00 = (station_blh.L * 3600.0) / 206264.80624709636;
  this = &rotation;
  Matrix<double,_3,_3>::Matrix(this);
  local_98 = sin(__x);
  local_98 = -local_98;
  dVar1 = cos(__x_00);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,0,0);
  *pdVar3 = dVar1 * local_98;
  local_98 = sin(__x);
  local_98 = -local_98;
  dVar1 = sin(__x_00);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,0,1);
  *pdVar3 = dVar1 * local_98;
  dVar1 = cos(__x);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,0,2);
  *pdVar3 = dVar1;
  local_98 = sin(__x_00);
  local_98 = -local_98;
  pdVar3 = Matrix<double,_3,_3>::operator()(this,1,0);
  *pdVar3 = local_98;
  dVar1 = cos(__x_00);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,1,1);
  *pdVar3 = dVar1;
  pdVar3 = Matrix<double,_3,_3>::operator()(this,1,2);
  *pdVar3 = 0.0;
  dVar1 = cos(__x);
  dVar2 = cos(__x_00);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,2,0);
  *pdVar3 = dVar2 * dVar1;
  dVar1 = cos(__x);
  dVar2 = sin(__x_00);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,2,1);
  *pdVar3 = dVar2 * dVar1;
  dVar1 = sin(__x);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,2,2);
  *pdVar3 = dVar1;
  Matrix<double,_3,_1>::Matrix(&vec);
  pdVar3 = Matrix<double,_3,_1>::operator()(&vec,0,0);
  *pdVar3 = obj.X - station.X;
  pdVar3 = Matrix<double,_3,_1>::operator()(&vec,1,0);
  *pdVar3 = obj.Y - station.Y;
  pdVar3 = Matrix<double,_3,_1>::operator()(&vec,2,0);
  *pdVar3 = obj.Z - station.Z;
  result = Matrix<double,3,3>::operator*((Matrix<double,3,3> *)this,&vec);
  pdVar3 = Matrix<double,_3,_1>::operator()(&result,0,0);
  neu->X = *pdVar3;
  pdVar3 = Matrix<double,_3,_1>::operator()(&result,1,0);
  neu->Y = *pdVar3;
  pdVar3 = Matrix<double,_3,_1>::operator()(&result,2,0);
  neu->Z = *pdVar3;
  Matrix<double,_3,_1>::deleteMatrix(&vec);
  Matrix<double,_3,_1>::deleteMatrix(&result);
  Matrix<double,_3,_3>::deleteMatrix(this);
  this->data = (double *)0x0;
  this->rows = 3;
  this->cols = 3;
  pdVar3 = (double *)operator_new__(0x48);
  this->data = pdVar3;
  return SUB81(pdVar3,0);
}

Assistant:

bool XYZ2NEU(const XYZ station, const XYZ obj, ELLIPSOID type, XYZ &neu)
{
    BLH station_blh;

    XYZ2BLH(station, type, station_blh);
    // cout << station_blh << endl;
    double B = Deg2Rad(station_blh.B);
    double L = Deg2Rad(station_blh.L);
    Matrix3d rotation;
    rotation(0, 0) = -sin(B) * cos(L);
    rotation(0, 1) = -sin(B) * sin(L);
    rotation(0, 2) = cos(B);

    rotation(1, 0) = -sin(L);
    rotation(1, 1) = cos(L);
    rotation(1, 2) = 0;

    rotation(2, 0) = cos(B) * cos(L);
    rotation(2, 1) = cos(B) * sin(L);
    rotation(2, 2) = sin(B);

    Vector3d vec;
    vec(0, 0) = obj.X - station.X;
    vec(1, 0) = obj.Y - station.Y;
    vec(2, 0) = obj.Z - station.Z;

    Vector3d result = rotation * vec;
    neu.X = result(0, 0);
    neu.Y = result(1, 0);
    neu.Z = result(2, 0);
    vec.deleteMatrix();
    result.deleteMatrix();
    rotation.deleteMatrix();
}